

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O0

Sphere * embree::addUserGeometrySphere(RTCScene scene,Vec3fa *p,float r,uint num_time_steps)

{
  undefined8 uVar1;
  uint uVar2;
  size_t size;
  Sphere *pSVar3;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  Sphere *sphere;
  RTCGeometry geom;
  size_t in_stack_ffffffffffffffc8;
  
  size = rtcNewGeometry(g_device,0x78);
  pSVar3 = (Sphere *)alignedUSMMalloc(size,in_stack_ffffffffffffffc8,DEFAULT);
  uVar1 = in_RSI[1];
  *(undefined8 *)&(pSVar3->p).field_0 = *in_RSI;
  *(undefined8 *)((long)&(pSVar3->p).field_0 + 8) = uVar1;
  pSVar3->r = in_XMM0_Da;
  uVar2 = rtcAttachGeometry(in_RDI,size);
  pSVar3->geomID = uVar2;
  pSVar3->num_time_steps = in_EDX;
  rtcSetGeometryUserPrimitiveCount(size,1);
  rtcSetGeometryTimeStepCount(size,in_EDX);
  rtcSetGeometryUserData(size,pSVar3);
  rtcSetGeometryBoundsFunction(size,sphereBoundsFunc,0);
  rtcCommitGeometry(size);
  rtcReleaseGeometry(size);
  return pSVar3;
}

Assistant:

Sphere* addUserGeometrySphere (RTCScene scene, const Vec3fa& p, float r, unsigned int num_time_steps)
{
  RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_USER);
  Sphere* sphere = (Sphere*) alignedUSMMalloc(sizeof(Sphere),16);
  sphere->p = p;
  sphere->r = r;
  sphere->geomID = rtcAttachGeometry(scene,geom);
  sphere->num_time_steps = num_time_steps;
  rtcSetGeometryUserPrimitiveCount(geom,1);
  rtcSetGeometryTimeStepCount(geom,num_time_steps);
  rtcSetGeometryUserData(geom,sphere);
  rtcSetGeometryBoundsFunction(geom,sphereBoundsFunc,nullptr);
#if !USE_ARGUMENT_CALLBACKS
  rtcSetGeometryIntersectFunction(geom,sphereIntersectFuncPtr);
  rtcSetGeometryOccludedFunction (geom,sphereOccludedFuncPtr);
#endif
  rtcCommitGeometry(geom);
  rtcReleaseGeometry(geom);
  return sphere;
}